

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

int sprkStep_Init(ARKodeMem ark_mem,int init_type)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  ARKodeSPRKTable pAVar4;
  int iVar5;
  int iVar6;
  ARKODE_SPRKMethodID id;
  
  plVar2 = (long *)ark_mem->step_mem;
  if (plVar2 == (long *)0x0) {
    arkProcessError(ark_mem,-0x15,0x2e8,"sprkStep_Init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
    iVar6 = -0x15;
  }
  else {
    iVar5 = 0;
    iVar6 = 0;
    if (init_type != 1) {
      if ((init_type == 0) && (*plVar2 == 0)) {
        uVar3 = (int)plVar2[1] - 1;
        id = ARKODE_SPRK_MCLACHLAN_4_4;
        if (uVar3 < 10) {
          id = *(ARKODE_SPRKMethodID *)(&DAT_00168a30 + (ulong)uVar3 * 4);
        }
        pAVar4 = ARKodeSPRKTable_Load(id);
        *plVar2 = (long)pAVar4;
      }
      iVar1 = *(int *)*plVar2;
      iVar6 = iVar5;
      if ((iVar1 < 2) || (ark_mem->interp_degree < iVar1)) {
        if ((iVar1 == 1) && (1 < ark_mem->interp_degree)) {
          ark_mem->interp_degree = 1;
        }
      }
      else {
        ark_mem->interp_degree = iVar1 + -1;
      }
    }
  }
  return iVar6;
}

Assistant:

int sprkStep_Init(ARKodeMem ark_mem, int init_type)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    if (!step_mem->method)
    {
      switch (step_mem->q)
      {
      case 1:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_1);
        break;
      case 2:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_2);
        break;
      case 3:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_3);
        break;
      case 4:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      case 5:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_5);
        break;
      case 6:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_6);
        break;
      case 7:
      case 8:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_8);
        break;
      case 9:
      case 10:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_10);
        break;
      default:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      }
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->method->q > 1 &&
      ark_mem->interp_degree > (step_mem->method->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->method->q - 1;
  }
  else if (step_mem->method->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  return (ARK_SUCCESS);
}